

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

uint zreceive(zbuf *z,int n)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = z->num_bits;
  if (iVar2 < n) {
    fill_bits(z);
    iVar2 = z->num_bits;
  }
  uVar1 = z->code_buffer;
  z->code_buffer = uVar1 >> ((byte)n & 0x1f);
  z->num_bits = iVar2 - n;
  return ~(-1 << ((byte)n & 0x1f)) & uVar1;
}

Assistant:

__forceinline static unsigned int zreceive(zbuf *z, int n)
{
   unsigned int k;
   if (z->num_bits < n) fill_bits(z);
   k = z->code_buffer & ((1 << n) - 1);
   z->code_buffer >>= n;
   z->num_bits -= n;
   return k;
}